

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  char *pcVar1;
  uint uVar2;
  float *pfVar3;
  char *in_text;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint c;
  uint local_54;
  char *local_50;
  float local_44;
  char *local_40;
  float *local_38;
  
  local_38 = &this->FallbackXAdvance;
  bVar4 = true;
  fVar5 = 0.0;
  local_40 = (char *)0x0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  local_50 = text;
  local_44 = scale;
LAB_00151961:
  do {
    in_text = text;
    if (text_end <= in_text) {
      return in_text;
    }
    local_54 = (uint)*in_text;
    if (*in_text < '\0') {
      uVar2 = ImTextCharFromUtf8(&local_54,in_text,text_end);
      text = in_text + uVar2;
    }
    else {
      text = in_text + 1;
    }
    uVar2 = local_54;
    if (local_54 == 0) {
      return in_text;
    }
    if (local_54 < 0x20) {
      if (local_54 == 10) {
        bVar4 = true;
        fVar5 = 0.0;
        fVar6 = 0.0;
        fVar7 = 0.0;
        goto LAB_00151961;
      }
      if (local_54 == 0xd) goto LAB_00151961;
    }
    pfVar3 = local_38;
    if ((int)local_54 < (this->IndexXAdvance).Size) {
      pfVar3 = ImVector<float>::operator[](&this->IndexXAdvance,local_54);
    }
    if (((uVar2 == 9) || (uVar2 == 0x3000)) || (uVar2 == 0x20)) {
      if (bVar4) {
        fVar7 = fVar7 + fVar6;
        fVar6 = 0.0;
      }
      fVar6 = fVar6 + *pfVar3 * local_44;
LAB_00151a98:
      bVar4 = false;
    }
    else {
      fVar5 = fVar5 + *pfVar3 * local_44;
      pcVar1 = text;
      if (!bVar4) {
        fVar7 = fVar7 + fVar6 + fVar5;
        fVar5 = 0.0;
        fVar6 = 0.0;
        local_40 = local_50;
        pcVar1 = local_50;
      }
      local_50 = pcVar1;
      if ((uVar2 < 0x40) && ((0x8800500200000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0))
      goto LAB_00151a98;
      bVar4 = uVar2 != 0x22;
    }
    if (wrap_width <= fVar5 + fVar7) {
      if (local_40 != (char *)0x0) {
        local_50 = local_40;
      }
      if (fVar5 < wrap_width) {
        in_text = local_50;
      }
      return in_text;
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // Simple word-wrapping for English, not full-featured. Please submit failing cases!
    // FIXME: Much possible improvements (don't cut things like "word !", "word!!!" but cut within "word,,,,", more sensible support for punctuations, support for Unicode punctuations, etc.)

    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"

    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexXAdvance.Size ? IndexXAdvance[(int)c] : FallbackXAdvance) * scale;
        if (ImCharIsSpace(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = !(c == '.' || c == ',' || c == ';' || c == '!' || c == '?' || c == '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width >= wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    return s;
}